

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_absolute_pose.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  ostream *poVar2;
  long *plVar3;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *pDVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar16;
  undefined1 auVar15 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar17;
  timeval tVar18;
  timeval tic;
  timeval toc;
  translation_t t_perturbed;
  points_t points;
  bearingVectors_t bearingVectors;
  vector<int,_std::allocator<int>_> camCorrespondences;
  translation_t position;
  transformation_t epnp_transformation;
  MatrixXd gt;
  rotations_t camRotations;
  translations_t camOffsets;
  vector<int,_std::allocator<int>_> indices10;
  vector<int,_std::allocator<int>_> indices6;
  translation_t p2p_translation;
  CentralAbsoluteAdapter adapter;
  rotation_t R_perturbed;
  rotation_t rotation;
  transformation_t nonlinear_transformation_10;
  transformation_t epnp_transformation_6;
  transformation_t nonlinear_transformation;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *local_4f8;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *local_4f0;
  timeval local_4e8;
  timeval local_4d8;
  double local_4c8;
  translation_t local_4c0;
  points_t local_4a0;
  bearingVectors_t local_480;
  __suseconds_t local_460;
  __time_t local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  vector<int,_std::allocator<int>_> local_430;
  Vector3d local_418;
  translation_t local_400;
  double dStack_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double dStack_3c8;
  double dStack_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  DenseStorage<double,__1,__1,__1,_0> local_370;
  rotations_t local_350;
  translations_t local_330;
  vector<int,_std::allocator<int>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *local_2e0;
  double dStack_2d8;
  double local_2d0;
  CentralAbsoluteAdapter local_2c8;
  rotation_t local_250;
  Matrix3d local_208;
  transformation_t local_1c0;
  transformation_t local_160;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  
  opengv::initializeRandomSeed();
  opengv::generateRandomTranslation(&local_418,2.0);
  opengv::generateRandomRotation(&local_208,0.5);
  local_330.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_330.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_330.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_350.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_350.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_350.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem(&local_330,&local_350);
  local_480.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_480.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_480.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_370.m_cols = 0;
  local_370.m_data = (double *)0x0;
  local_370.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_370,300,3,100);
  opengv::generateRandom2D3DCorrespondences
            (&local_418,&local_208,&local_330,&local_350,100,0.0,0.0,&local_480,&local_4a0,
             &local_430,(MatrixXd *)&local_370);
  opengv::printExperimentCharacteristics(&local_418,&local_208,0.0,0.0);
  opengv::absolute_pose::CentralAbsoluteAdapter::CentralAbsoluteAdapter
            (&local_2c8,&local_480,&local_4a0,&local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running Kneip\'s P2P (first two correspondences)",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    opengv::absolute_pose::p2p(&local_400,&local_2c8.super_AbsoluteAdapterBase,0,1);
    lVar5 = lVar5 + -1;
    local_2d0 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2];
    local_2e0 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    dStack_2d8 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
  } while (lVar5 != 0);
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar17 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar18 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running Kneip\'s P3P (first three correspondences)",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar6._0_8_ = (double)tVar17.tv_sec;
  auVar6._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = (double)tVar18.tv_usec;
  auVar11._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar11,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_438 = auVar6._0_8_ / 50.0;
  local_4f0 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    pDVar4 = local_4f0;
    opengv::absolute_pose::p3p_kneip
              ((transformations_t *)&local_400,&local_2c8.super_AbsoluteAdapterBase,0,1,2);
    dVar1 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
    local_4f0 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    if (pDVar4 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
      free(*(void **)(pDVar4 + -8));
      if ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
          local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
        free(*(void **)((long)local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[0] + -8));
      }
    }
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar17 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar18 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running Gao\'s P3P (first three correspondences)",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar7._0_8_ = (double)tVar17.tv_sec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar12._0_8_ = (double)tVar18.tv_usec;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar12,auVar7,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_440 = auVar6._0_8_ / 50.0;
  local_4f8 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    pDVar4 = local_4f8;
    opengv::absolute_pose::p3p_gao
              ((transformations_t *)&local_400,&local_2c8.super_AbsoluteAdapterBase,0,1,2);
    local_4c8 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1];
    local_4f8 = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    if (pDVar4 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
      free(*(void **)(pDVar4 + -8));
      if ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
          local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
        free(*(void **)((long)local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[0] + -8));
      }
    }
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar17 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar18 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running epnp (all correspondences)",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  auVar8._0_8_ = (double)tVar17.tv_sec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar13._0_8_ = (double)tVar18.tv_usec;
  auVar13._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar13,auVar8,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_448 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    opengv::absolute_pose::epnp(&local_160,&local_2c8.super_AbsoluteAdapterBase);
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
    local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
    lVar5 = lVar5 + -1;
    dStack_3c0 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[8];
    dStack_3b8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[9];
    dStack_3b0 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[10];
    dStack_3a8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[0xb];
    dStack_3e8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[3];
    dStack_3e0 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[4];
    dStack_3d8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[5];
    dStack_3d0 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[6];
    dStack_3c8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[7];
  } while (lVar5 != 0);
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar17 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar18 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"running epnp with 6 correspondences",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getNindices(&local_2f8,6);
  opengv::absolute_pose::epnp(&local_160,&local_2c8.super_AbsoluteAdapterBase,&local_2f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"and performing nonlinear optimization",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getPerturbedPose(&local_418,&local_208,&local_4c0,&local_250,0.1);
  auVar9._0_8_ = (double)tVar17.tv_sec;
  auVar9._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = (double)tVar18.tv_usec;
  auVar14._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar14,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_450 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar5 = 0x32;
  do {
    local_2c8.super_AbsoluteAdapterBase._t.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    local_2c8.super_AbsoluteAdapterBase._t.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_2c8.super_AbsoluteAdapterBase._t.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    local_2c8.super_AbsoluteAdapterBase._R.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    opengv::absolute_pose::optimize_nonlinear(&local_1c0,&local_2c8.super_AbsoluteAdapterBase);
    lVar5 = lVar5 + -1;
    dStack_c0 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[8];
    dStack_b8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[9];
    dStack_b0 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[10];
    dStack_a8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[0xb];
    local_100 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[0];
    dStack_f8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[1];
    dStack_f0 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[2];
    dStack_e8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[3];
    local_e0 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[4];
    dStack_d8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[5];
    dStack_d0 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[6];
    dStack_c8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array[7];
  } while (lVar5 != 0);
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar17 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  local_458 = tVar17.tv_sec;
  tVar17 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  local_460 = tVar17.tv_usec;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"setting perturbed pose",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"and performing nonlinear optimization with 10 correspondences",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  opengv::getNindices(&local_310,10);
  opengv::getPerturbedPose(&local_418,&local_208,&local_4c0,&local_250,0.1);
  local_2c8.super_AbsoluteAdapterBase._t.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_2c8.super_AbsoluteAdapterBase._t.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_2c8.super_AbsoluteAdapterBase._t.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_4c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_2c8.super_AbsoluteAdapterBase._R.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_250.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  opengv::absolute_pose::optimize_nonlinear
            (&local_1c0,&local_2c8.super_AbsoluteAdapterBase,&local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from P2P algorithm:",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from Kneip\'s P3P algorithm:",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((long)dVar1 - (long)local_4f0 != 0) {
    lVar5 = ((long)dVar1 - (long)local_4f0 >> 5) * -0x5555555555555555;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pDVar4 = local_4f0;
    do {
      poVar2 = Eigen::operator<<((ostream *)&std::cout,pDVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      plVar3 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      pDVar4 = pDVar4 + 0x60;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from Gao\'s P3P algorithm:",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_4c8 = (double)((long)local_4c8 - (long)local_4f8);
  if (local_4c8 != 0.0) {
    lVar5 = ((long)local_4c8 >> 5) * -0x5555555555555555;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pDVar4 = local_4f8;
    do {
      poVar2 = Eigen::operator<<((ostream *)&std::cout,pDVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      plVar3 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      pDVar4 = pDVar4 + 0x60;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from epnp algorithm:",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_400);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from epnp algorithm with only 6 correspondences:",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_160);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nonlinear algorithm:",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_100);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"results from nonlinear algorithm with only 10 correspondences:",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_1c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from P2P algorithm: ",0x1c);
  poVar2 = std::ostream::_M_insert<double>(local_438);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from Kneip\'s P3P algorithm: ",0x24);
  poVar2 = std::ostream::_M_insert<double>(local_440);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from Gao\'s P3P algorithm: ",0x22);
  poVar2 = std::ostream::_M_insert<double>(local_448);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from epnp algorithm: ",0x1d);
  poVar2 = std::ostream::_M_insert<double>(local_450);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar16 = extraout_XMM1_Qb;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"timings from nonlinear algorithm: ",0x22);
  auVar10._0_8_ = (double)local_458;
  auVar10._8_8_ = uVar16;
  auVar15._0_8_ = (double)local_460;
  auVar15._8_8_ = uVar16;
  auVar6 = vfmadd132sd_fma(auVar15,auVar10,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar2 = std::ostream::_M_insert<double>(auVar6._0_8_ / 50.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4f8 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
    free(*(void **)((double)local_4f8 + -8));
  }
  if (local_4f0 != (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0x0) {
    free(*(void **)((double)local_4f0 + -8));
  }
  opengv::absolute_pose::CentralAbsoluteAdapter::~CentralAbsoluteAdapter(&local_2c8);
  if (local_370.m_data != (double *)0x0) {
    free((void *)local_370.m_data[-1]);
  }
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4a0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_4a0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_480.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_480.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  if (local_350.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_350.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (local_330.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_330.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 100;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);
  
  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );
  
  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors;
  points_t points;
  std::vector<int> camCorrespondences; //unused in the central case!
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D3DCorrespondences(
      position, rotation, camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors, points, camCorrespondences, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a central absolute adapter
  absolute_pose::CentralAbsoluteAdapter adapter(
      bearingVectors,
      points,
      rotation );

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //run the experiments
  std::cout << "running Kneip's P2P (first two correspondences)" << std::endl;
  translation_t p2p_translation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p2p_translation = absolute_pose::p2p(adapter);
  gettimeofday( &toc, 0 );
  double p2p_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running Kneip's P3P (first three correspondences)" << std::endl;
  transformations_t p3p_kneip_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p3p_kneip_transformations = absolute_pose::p3p_kneip(adapter);
  gettimeofday( &toc, 0 );
  double p3p_kneip_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running Gao's P3P (first three correspondences)" << std::endl;
  transformations_t p3p_gao_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p3p_gao_transformations = absolute_pose::p3p_gao(adapter);
  gettimeofday( &toc, 0 );
  double p3p_gao_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running epnp (all correspondences)" << std::endl;
  transformation_t epnp_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    epnp_transformation = absolute_pose::epnp(adapter);
  gettimeofday( &toc, 0 );
  double epnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running epnp with 6 correspondences" << std::endl;
  std::vector<int> indices6 = getNindices(6);
  transformation_t epnp_transformation_6 =
      absolute_pose::epnp(adapter,indices6);

  std::cout << "setting perturbed pose";
  std::cout << "and performing nonlinear optimization" << std::endl;
  //add a small perturbation to the pose
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett(t_perturbed);
    adapter.setR(R_perturbed);
    nonlinear_transformation = absolute_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose";
  std::cout << "and performing nonlinear optimization with 10 correspondences";
  std::cout << std::endl;
  std::vector<int> indices10 = getNindices(10);
  //add a small perturbation to the pose
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  adapter.sett(t_perturbed);
  adapter.setR(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      absolute_pose::optimize_nonlinear(adapter,indices10);

  //print the results
  std::cout << "results from P2P algorithm:" << std::endl;
  std::cout << p2p_translation << std::endl << std::endl;
  std::cout << "results from Kneip's P3P algorithm:" << std::endl;
  for(size_t i = 0; i < p3p_kneip_transformations.size(); i++)
    std::cout << p3p_kneip_transformations[i] << std::endl << std::endl;
  std::cout << "results from Gao's P3P algorithm:" << std::endl;
  for(size_t i = 0; i < p3p_gao_transformations.size(); i++)
    std::cout << p3p_gao_transformations[i] << std::endl << std::endl;
  std::cout << "results from epnp algorithm:" << std::endl;
  std::cout << epnp_transformation << std::endl << std::endl;
  std::cout << "results from epnp algorithm with only 6 correspondences:";
  std::cout << std::endl;
  std::cout << epnp_transformation_6 << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only 10 correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from P2P algorithm: ";
  std::cout << p2p_time << std::endl;
  std::cout << "timings from Kneip's P3P algorithm: ";
  std::cout << p3p_kneip_time << std::endl;
  std::cout << "timings from Gao's P3P algorithm: ";
  std::cout << p3p_gao_time << std::endl;
  std::cout << "timings from epnp algorithm: ";
  std::cout << epnp_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}